

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,KotlinKMPGenerator *this,FieldDef *field)

{
  BaseType t;
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  Type *type;
  bool local_1fc;
  bool local_1fa;
  allocator<char> local_1b2;
  allocator<char> local_1b1;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  allocator<char> local_129;
  Type local_128;
  Type local_108;
  Type local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  Type local_a8;
  allocator<char> local_86;
  undefined1 local_85;
  undefined4 local_84;
  allocator<char> local_7d [13];
  undefined1 local_70 [8];
  string suffix;
  string field_name;
  BaseType base_type;
  Value *value;
  FieldDef *field_local;
  KotlinKMPGenerator *this_local;
  string *val;
  
  t = (field->value).type.base_type;
  std::__cxx11::string::string((string *)(suffix.field_2._M_local_buf + 8),(string *)field);
  LiteralSuffix_abi_cxx11_((string *)local_70,(KotlinKMPGenerator *)&field->value,type);
  bVar1 = FieldDef::IsScalarOptional(field);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"null",local_7d);
    std::allocator<char>::~allocator(local_7d);
  }
  else {
    bVar1 = IsFloat(t);
    if (bVar1) {
      local_85 = 0;
      FloatConstantGenerator::GenFloatConstant_abi_cxx11_
                (__return_storage_ptr__,
                 (FloatConstantGenerator *)(anonymous_namespace)::KotlinFloatGen,field);
      if ((t == BASE_TYPE_DOUBLE) && (pcVar3 = (char *)std::__cxx11::string::back(), *pcVar3 == 'f')
         ) {
        std::__cxx11::string::pop_back();
      }
      local_85 = 1;
    }
    else if (t == BASE_TYPE_BOOL) {
      bVar1 = std::operator==(&(field->value).constant,"0");
      pcVar3 = "true";
      if (bVar1) {
        pcVar3 = "false";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,pcVar3,&local_86);
      std::allocator<char>::~allocator(&local_86);
    }
    else {
      bVar1 = IsEnum(&(field->value).type);
      local_1fa = true;
      if (!bVar1) {
        bVar1 = IsVector(&(field->value).type);
        local_1fc = false;
        if (bVar1) {
          Type::VectorType(&local_a8,&(field->value).type);
          local_1fc = IsEnum(&local_a8);
        }
        local_1fa = local_1fc;
      }
      if (local_1fa == false) {
        bVar2 = IsVector(&(field->value).type);
        bVar1 = false;
        if (bVar2) {
          Type::VectorType(&local_e8,&(field->value).type);
          bVar1 = true;
          if (local_e8.base_type != BASE_TYPE_UNION) {
            Type::VectorType(&local_108,&(field->value).type);
            bVar1 = true;
            if (local_108.base_type != BASE_TYPE_STRUCT) {
              Type::VectorType(&local_128,&(field->value).type);
              bVar1 = local_128.base_type == BASE_TYPE_STRING;
            }
          }
        }
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"null",&local_129);
          std::allocator<char>::~allocator(&local_129);
        }
        else {
          bVar1 = IsVector(&(field->value).type);
          if (bVar1) {
            switch((field->value).type.element) {
            case BASE_TYPE_UTYPE:
              IdlNamer::Type_abi_cxx11_(&local_1b0,&this->namer_,(field->value).type.enum_def);
              std::operator+(&local_190,&local_1b0,"(");
              std::operator+(&local_170,&local_190,&(field->value).constant);
              std::operator+(&local_150,&local_170,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_70);
              std::operator+(__return_storage_ptr__,&local_150,")");
              std::__cxx11::string::~string((string *)&local_150);
              std::__cxx11::string::~string((string *)&local_170);
              std::__cxx11::string::~string((string *)&local_190);
              std::__cxx11::string::~string((string *)&local_1b0);
              break;
            case BASE_TYPE_BOOL:
              bVar1 = std::operator==(&(field->value).constant,"0");
              pcVar3 = "true";
              if (bVar1) {
                pcVar3 = "false";
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__return_storage_ptr__,pcVar3,&local_1b2);
              std::allocator<char>::~allocator(&local_1b2);
              break;
            default:
              std::operator+(__return_storage_ptr__,&(field->value).constant,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_70);
              break;
            case BASE_TYPE_FLOAT:
              std::operator+(__return_storage_ptr__,&(field->value).constant,"f");
              break;
            case BASE_TYPE_DOUBLE:
              std::operator+(__return_storage_ptr__,&(field->value).constant,".toDouble()");
              break;
            case BASE_TYPE_STRING:
            case BASE_TYPE_STRUCT:
            case BASE_TYPE_UNION:
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__return_storage_ptr__,"null",&local_1b1);
              std::allocator<char>::~allocator(&local_1b1);
            }
          }
          else {
            std::operator+(__return_storage_ptr__,&(field->value).constant,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_70);
          }
        }
      }
      else {
        std::operator+(&local_c8,&(field->value).constant,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                      );
        WrapEnumValue(__return_storage_ptr__,this,&(field->value).type,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
      }
    }
  }
  local_84 = 1;
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(suffix.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string GenDefaultValue(const FieldDef &field) const {
    auto &value = field.value;
    auto base_type = value.type.base_type;
    auto field_name = field.name;
    std::string suffix = LiteralSuffix(value.type);
    if (field.IsScalarOptional()) { return "null"; }
    if (IsFloat(base_type)) {
      auto val = KotlinFloatGen.GenFloatConstant(field);
      if (base_type == BASE_TYPE_DOUBLE && val.back() == 'f') {
        val.pop_back();
      }
      return val;
    }

    if (base_type == BASE_TYPE_BOOL) {
      return value.constant == "0" ? "false" : "true";
    }

    if (IsEnum(field.value.type) ||
        (IsVector(field.value.type) && IsEnum(field.value.type.VectorType()))) {
      return WrapEnumValue(field.value.type, value.constant + suffix);
    }

    if (IsVector(field.value.type) &&
        (field.value.type.VectorType().base_type == BASE_TYPE_UNION ||
         field.value.type.VectorType().base_type == BASE_TYPE_STRUCT ||
         field.value.type.VectorType().base_type == BASE_TYPE_STRING)) {
      return "null";
    }
    if (IsVector(field.value.type)) {
      switch (field.value.type.element) {
        case BASE_TYPE_UTYPE:
          return namer_.Type(*field.value.type.enum_def) + "(" +
                 value.constant + suffix + ")";
        case BASE_TYPE_UNION:
        case BASE_TYPE_STRUCT:
        case BASE_TYPE_STRING: return "null";
        case BASE_TYPE_BOOL: return value.constant == "0" ? "false" : "true";
        case BASE_TYPE_FLOAT: return value.constant + "f";
        case BASE_TYPE_DOUBLE: {
          return value.constant + ".toDouble()";
        }
        default: return value.constant + suffix;
      }
    }
    return value.constant + suffix;
  }